

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluator.c
# Opt level: O2

Value * apply_multiplication_operation(Value *left_value,Value *right_value)

{
  Value *pVVar1;
  longdouble lVar2;
  longdouble lVar3;
  
  if (left_value->value_type == ValueTypeIntegerValue) {
    if (right_value->value_type == ValueTypeIntegerValue) {
      pVVar1 = new_integer_value(*(long *)(right_value + 1) * *(long *)(left_value + 1));
      return pVVar1;
    }
    if ((right_value->value_type & ~ValueTypeBoolValue) != ValueTypeIntegerValue) {
LAB_00106fb1:
      pVVar1 = new_null_value();
      return pVVar1;
    }
    lVar3 = (longdouble)*(long *)(left_value + 1);
  }
  else {
    if (((left_value->value_type & ~ValueTypeBoolValue) != ValueTypeIntegerValue) ||
       ((right_value->value_type & ~ValueTypeBoolValue) != ValueTypeIntegerValue))
    goto LAB_00106fb1;
    lVar3 = *(longdouble *)&left_value[1].linked_variable_count;
    if (right_value->value_type != ValueTypeFloatValue) {
      lVar2 = (longdouble)*(long *)(right_value + 1);
      goto LAB_00106fa2;
    }
  }
  lVar2 = *(longdouble *)&right_value[1].linked_variable_count;
LAB_00106fa2:
  pVVar1 = new_float_value(lVar2 * lVar3);
  return pVVar1;
}

Assistant:

Value *apply_multiplication_operation(Value *left_value, Value *right_value) {
  if (left_value->value_type == ValueTypeIntegerValue && right_value->value_type == ValueTypeIntegerValue) {
    return new_integer_value(((IntegerValue *) left_value)->integer_value * ((IntegerValue *) right_value)->integer_value);
  }
  else if ((left_value->value_type == ValueTypeIntegerValue || left_value->value_type == ValueTypeFloatValue) && (right_value->value_type == ValueTypeIntegerValue || right_value->value_type == ValueTypeFloatValue)) {
    long double left_float, right_float;

    if (left_value->value_type == ValueTypeFloatValue) left_float = ((FloatValue *) left_value)->float_value;
    else left_float = ((IntegerValue *) left_value)->integer_value;

    if (right_value->value_type == ValueTypeFloatValue) right_float = ((FloatValue *) right_value)->float_value;
    else right_float = ((IntegerValue *) right_value)->integer_value;

    return new_float_value(left_float * right_float);
  }

  return new_null_value();
}